

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O3

int __thiscall
cppcms::http::details::gzip_buf::do_write(gzip_buf *this,char *p,int n,int flush_flag)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = -1;
  if ((this->out_ != (extended_streambuf *)0x0) && (this->opened_ == true)) {
    iVar2 = 0;
    iVar4 = 0;
    if (flush_flag != 0 || n != 0) {
      (this->z_stream_).avail_in = n;
      (this->z_stream_).next_in = (Bytef *)p;
      do {
        (this->z_stream_).avail_out = (uInt)this->buffer_;
        (this->z_stream_).next_out =
             (Bytef *)(this->chunk_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        deflate(&this->z_stream_,flush_flag);
        pcVar1 = (this->chunk_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar5 = (long)(int)((*(int *)&(this->chunk_).super__Vector_base<char,_std::allocator<char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (int)pcVar1) -
                           (this->z_stream_).avail_out);
        lVar3 = (**(code **)(*(long *)this->out_ + 0x60))(this->out_,pcVar1,lVar5);
        if (lVar3 != lVar5) goto LAB_001d058c;
      } while ((this->z_stream_).avail_out == 0);
      iVar4 = iVar2;
      if ((flush_flag == 2) && (this->out_ != (extended_streambuf *)0x0)) {
        iVar2 = (**(code **)(*(long *)this->out_ + 0x30))();
        if (iVar2 < 0) {
LAB_001d058c:
          this->out_ = (extended_streambuf *)0x0;
          iVar4 = -1;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int do_write(char const *p,int n,int flush_flag)
		{
			if(!out_ || !opened_) {
				return -1;
			}

			if(n==0 && flush_flag==Z_NO_FLUSH) {
				return 0;
			}

			z_stream_.avail_in = n;
			z_stream_.next_in = (Bytef*)(p);

			do {
				z_stream_.avail_out = buffer_;
				z_stream_.next_out = (Bytef*)(&chunk_[0]);
				deflate(&z_stream_,flush_flag);
				int have = chunk_.size() - z_stream_.avail_out;
				if(out_->sputn(&chunk_[0],have)!=have) {
					out_ = 0;
					return -1;
				}
			} while(z_stream_.avail_out == 0);

			if(flush_flag == Z_SYNC_FLUSH && out_ && out_->pubsync() < 0) {
				out_ = 0;
				return -1;
			}

			return 0;
		}